

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

bool __thiscall CsvModelSerialiser::saveModel(CsvModelSerialiser *this,QString *destination)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  CsvModelSerialiserPrivate *this_00;
  QTextStream local_38 [8];
  QTextStream writer;
  CsvModelSerialiserPrivate *d;
  QString *destination_local;
  CsvModelSerialiser *this_local;
  
  if (destination == (QString *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = d_func(this);
    if ((this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate.
        super_AbstractModelSerialiserPrivate.m_constModel == (QAbstractItemModel *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      QVar1 = operator|(WriteOnly,Text);
      QTextStream::QTextStream(local_38,(QString *)destination,(QFlags_conflict1 *)(ulong)QVar1.i);
      this_local._7_1_ = CsvModelSerialiserPrivate::writeCsv(this_00,local_38);
      QTextStream::~QTextStream(local_38);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CsvModelSerialiser::saveModel(QString *destination) const
{
    if (!destination)
        return false;
    Q_D(const CsvModelSerialiser);

    if (!d->m_constModel)
        return false;
    QTextStream writer(destination, QIODevice::WriteOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    return d->writeCsv(writer);
}